

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode_machine.cpp
# Opt level: O1

void __thiscall
randomx::BytecodeMachine::compileInstruction
          (BytecodeMachine *this,Instruction *instr,int i,InstructionByteCode *ibc)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint64_t uVar5;
  ulong uVar6;
  int_reg_t *piVar7;
  anon_union_8_2_131e9d4c_for_InstructionByteCode_4 aVar8;
  long lVar9;
  uint32_t uVar10;
  anon_union_8_2_131e9d4c_for_InstructionByteCode_4 *paVar11;
  NativeRegisterFile *pNVar12;
  anon_union_8_2_131e9d4c_for_InstructionByteCode_4 aVar13;
  uint uVar14;
  
  bVar2 = instr->opcode;
  if (bVar2 < 0x10) {
    uVar4 = instr->dst & 7;
    bVar2 = instr->src;
    ibc->type = IADD_RS;
    (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar4 * 8));
    (ibc->field_1).isrc = (int_reg_t *)((long)this->nreg->r + (ulong)((bVar2 & 7) << 3));
    (ibc->field_4).shift = instr->mod >> 2 & 3;
    uVar5 = 0;
    if (uVar4 == 5) {
      uVar5 = (long)(int)instr->imm32;
    }
    (ibc->field_2).imm = uVar5;
    uVar6 = (ulong)uVar4;
    goto LAB_00123318;
  }
  if (bVar2 < 0x17) {
    uVar6 = (ulong)(instr->dst & 7);
    uVar4 = instr->src & 7;
    ibc->type = IADD_M;
  }
  else {
    if (bVar2 < 0x27) {
      uVar6 = (ulong)(instr->dst & 7);
      uVar4 = instr->src & 7;
      ibc->type = ISUB_R;
LAB_00123245:
      (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uint)((int)uVar6 * 8));
      if ((char)uVar4 == (char)uVar6) {
        aVar13 = (anon_union_8_2_131e9d4c_for_InstructionByteCode_4)(long)(int)instr->imm32;
LAB_0012325f:
        paVar11 = &ibc->field_2;
        ibc->field_2 = aVar13;
      }
      else {
LAB_0012330d:
        paVar11 = (anon_union_8_2_131e9d4c_for_InstructionByteCode_4 *)
                  ((long)this->nreg->r + (ulong)(uVar4 << 3));
      }
      (ibc->field_1).isrc = (int_reg_t *)paVar11;
      goto LAB_00123318;
    }
    if (0x2d < bVar2) {
      if (bVar2 < 0x3e) {
        uVar6 = (ulong)(instr->dst & 7);
        uVar4 = instr->src & 7;
        ibc->type = IMUL_R;
        goto LAB_00123245;
      }
      if (bVar2 < 0x42) {
        uVar6 = (ulong)(instr->dst & 7);
        uVar4 = instr->src & 7;
        ibc->type = IMUL_M;
        goto LAB_00123201;
      }
      if (bVar2 < 0x46) {
        bVar2 = instr->dst;
        bVar3 = instr->src;
        ibc->type = IMULH_R;
LAB_001232ff:
        uVar4 = bVar3 & 7;
        uVar6 = (ulong)(bVar2 & 7);
        (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)((bVar2 & 7) * 8));
        goto LAB_0012330d;
      }
      if (bVar2 == 0x46) {
        uVar6 = (ulong)(instr->dst & 7);
        uVar4 = instr->src & 7;
        ibc->type = IMULH_M;
        goto LAB_00123201;
      }
      if (bVar2 < 0x4b) {
        bVar2 = instr->dst;
        bVar3 = instr->src;
        ibc->type = ISMULH_R;
        goto LAB_001232ff;
      }
      if (bVar2 == 0x4b) {
        uVar6 = (ulong)(instr->dst & 7);
        uVar4 = instr->src & 7;
        ibc->type = ISMULH_M;
        goto LAB_00123201;
      }
      if (bVar2 < 0x54) {
        uVar4 = instr->imm32;
        if ((uVar4 & uVar4 - 1) != 0) {
          uVar14 = instr->dst & 7;
          ibc->type = IMUL_R;
          (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar14 * 8));
          uVar5 = randomx_reciprocal((ulong)uVar4);
          (ibc->field_2).imm = uVar5;
          (ibc->field_1).isrc = (int_reg_t *)&ibc->field_2;
          this->registerUsage[uVar14] = i;
          return;
        }
LAB_00123389:
        ibc->type = NOP;
        return;
      }
      if (bVar2 < 0x56) {
        uVar4 = instr->dst & 7;
        uVar6 = (ulong)uVar4;
        ibc->type = INEG_R;
        (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar4 * 8));
        goto LAB_00123318;
      }
      if (bVar2 < 0x65) {
        uVar6 = (ulong)(instr->dst & 7);
        uVar4 = instr->src & 7;
        ibc->type = IXOR_R;
        goto LAB_00123245;
      }
      if (bVar2 < 0x6a) {
        uVar6 = (ulong)(instr->dst & 7);
        uVar4 = instr->src & 7;
        ibc->type = IXOR_M;
        goto LAB_00123201;
      }
      if (bVar2 < 0x72) {
        bVar2 = instr->dst;
        bVar3 = instr->src;
        ibc->type = IROR_R;
      }
      else {
        if (0x73 < bVar2) {
          if (bVar2 < 0x78) {
            uVar4 = instr->dst & 7;
            uVar14 = instr->src & 7;
            if ((char)uVar14 != (char)uVar4) {
              (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar4 * 8));
              (ibc->field_1).isrc = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar14 * 8));
              ibc->type = ISWAP_R;
              this->registerUsage[uVar4] = i;
              this->registerUsage[uVar14] = i;
              return;
            }
            goto LAB_00123389;
          }
          if (bVar2 < 0x7c) {
            uVar4 = instr->dst & 7;
            ibc->type = FSWAP_R;
            if ((byte)uVar4 < 4) {
              piVar7 = (int_reg_t *)((long)this->nreg->f[0] + (ulong)(uVar4 << 4));
              goto LAB_0012353f;
            }
            pNVar12 = this->nreg;
            uVar6 = (ulong)(uVar4 - 4) << 4;
LAB_00123536:
            piVar7 = (int_reg_t *)((long)pNVar12->e[0] + uVar6);
LAB_0012353f:
            (ibc->field_0).idst = piVar7;
            return;
          }
          if (bVar2 < 0x8c) {
            bVar2 = instr->dst;
            bVar3 = instr->src;
            ibc->type = FADD_R;
LAB_001234fe:
            piVar7 = (int_reg_t *)((long)this->nreg->f[0] + (ulong)((bVar2 & 3) << 4));
LAB_0012350c:
            (ibc->field_0).idst = piVar7;
            (ibc->field_1).isrc = (int_reg_t *)((long)this->nreg->a[0] + (ulong)((bVar3 & 3) << 4));
            return;
          }
          if (bVar2 < 0x91) {
            bVar2 = instr->dst;
            bVar3 = instr->src;
            ibc->type = FADD_M;
LAB_0012355f:
            piVar7 = (int_reg_t *)((long)this->nreg->f[0] + (ulong)((bVar2 & 3) << 4));
          }
          else {
            if (bVar2 < 0xa1) {
              bVar2 = instr->dst;
              bVar3 = instr->src;
              ibc->type = FSUB_R;
              goto LAB_001234fe;
            }
            if (bVar2 < 0xa6) {
              bVar2 = instr->dst;
              bVar3 = instr->src;
              ibc->type = FSUB_M;
              goto LAB_0012355f;
            }
            if (bVar2 < 0xac) {
              (ibc->field_0).idst =
                   (int_reg_t *)((long)this->nreg->f[0] + (ulong)((instr->dst & 3) << 4));
              ibc->type = FSCAL_R;
              return;
            }
            if (bVar2 < 0xcc) {
              bVar2 = instr->dst;
              bVar3 = instr->src;
              ibc->type = FMUL_R;
              piVar7 = (int_reg_t *)((long)this->nreg->e[0] + (ulong)((bVar2 & 3) << 4));
              goto LAB_0012350c;
            }
            if (0xcf < bVar2) {
              if (0xd5 < bVar2) {
                if (bVar2 < 0xef) {
                  ibc->type = CBRANCH;
                  uVar4 = instr->dst & 7;
                  (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar4 * 8));
                  ibc->field_4 = *(anon_union_2_2_d7ee7b4e_for_InstructionByteCode_7 *)
                                  (this->registerUsage + uVar4);
                  bVar2 = instr->mod >> 4;
                  (ibc->field_2).imm =
                       ((long)(int)instr->imm32 | 1L << bVar2 + 8) & ~(1L << bVar2 + 7);
                  ibc->memMask = 0xff00 << bVar2;
                  lVar9 = 0;
                  do {
                    piVar1 = this->registerUsage + lVar9;
                    *piVar1 = i;
                    piVar1[1] = i;
                    piVar1[2] = i;
                    piVar1[3] = i;
                    lVar9 = lVar9 + 4;
                  } while (lVar9 != 8);
                  return;
                }
                if (bVar2 != 0xef) {
                  bVar2 = instr->dst;
                  bVar3 = instr->src;
                  ibc->type = ISTORE;
                  (ibc->field_0).idst =
                       (int_reg_t *)((long)this->nreg->r + (ulong)((bVar2 & 7) << 3));
                  (ibc->field_1).isrc =
                       (int_reg_t *)((long)this->nreg->r + (ulong)((bVar3 & 7) << 3));
                  ibc->field_2 = (anon_union_8_2_131e9d4c_for_InstructionByteCode_4)
                                 (long)(int)instr->imm32;
                  if (instr->mod < 0xe0) {
                    uVar10 = 0x3ff8;
                    if ((instr->mod & 3) == 0) {
                      uVar10 = 0x3fff8;
                    }
                    ibc->memMask = uVar10;
                    return;
                  }
                  ibc->memMask = 0x1ffff8;
                  return;
                }
                (ibc->field_1).isrc =
                     (int_reg_t *)((long)this->nreg->r + (ulong)((instr->src & 7) << 3));
                ibc->type = CFROUND;
                aVar8._0_4_ = instr->imm32 & 0x3f;
                aVar8.imm._4_4_ = 0;
                goto LAB_00123593;
              }
              bVar2 = instr->dst;
              ibc->type = FSQRT_R;
              pNVar12 = this->nreg;
              uVar6 = (ulong)((bVar2 & 3) << 4);
              goto LAB_00123536;
            }
            bVar2 = instr->dst;
            bVar3 = instr->src;
            ibc->type = FDIV_M;
            piVar7 = (int_reg_t *)((long)this->nreg->e[0] + (ulong)((bVar2 & 3) << 4));
          }
          (ibc->field_0).idst = piVar7;
          (ibc->field_1).isrc = (int_reg_t *)((long)this->nreg->r + (ulong)((bVar3 & 7) << 3));
          uVar10 = 0x3ff8;
          if ((instr->mod & 3) == 0) {
            uVar10 = 0x3fff8;
          }
          ibc->memMask = uVar10;
          aVar8 = (anon_union_8_2_131e9d4c_for_InstructionByteCode_4)(long)(int)instr->imm32;
LAB_00123593:
          ibc->field_2 = aVar8;
          return;
        }
        bVar2 = instr->dst;
        bVar3 = instr->src;
        ibc->type = IROL_R;
      }
      uVar14 = bVar2 & 7;
      uVar4 = bVar3 & 7;
      uVar6 = (ulong)uVar14;
      (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar14 * 8));
      if ((char)uVar4 != (char)uVar14) goto LAB_0012330d;
      aVar13.imm._4_4_ = 0;
      aVar13.imm._0_4_ = instr->imm32;
      goto LAB_0012325f;
    }
    uVar6 = (ulong)(instr->dst & 7);
    uVar4 = instr->src & 7;
    ibc->type = ISUB_M;
  }
LAB_00123201:
  (ibc->field_0).idst = (int_reg_t *)((long)this->nreg->r + (ulong)(uint)((int)uVar6 * 8));
  ibc->field_2 = (anon_union_8_2_131e9d4c_for_InstructionByteCode_4)(long)(int)instr->imm32;
  if ((char)uVar4 == (char)uVar6) {
    (ibc->field_1).isrc = &zero;
    uVar10 = 0x1ffff8;
  }
  else {
    (ibc->field_1).isrc = (int_reg_t *)((long)this->nreg->r + (ulong)(uVar4 << 3));
    uVar10 = 0x3ff8;
    if ((instr->mod & 3) == 0) {
      uVar10 = 0x3fff8;
    }
  }
  ibc->memMask = uVar10;
LAB_00123318:
  this->registerUsage[uVar6] = i;
  return;
}

Assistant:

void BytecodeMachine::compileInstruction(RANDOMX_GEN_ARGS) {
		int opcode = instr.opcode;

		if (opcode < ceil_IADD_RS) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IADD_RS;
			ibc.idst = &nreg->r[dst];
			if (dst != RegisterNeedsDisplacement) {
				ibc.isrc = &nreg->r[src];
				ibc.shift = instr.getModShift();
				ibc.imm = 0;
			}
			else {
				ibc.isrc = &nreg->r[src];
				ibc.shift = instr.getModShift();
				ibc.imm = signExtend2sCompl(instr.getImm32());
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IADD_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IADD_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISUB_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISUB_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = signExtend2sCompl(instr.getImm32());
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISUB_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISUB_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMUL_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMUL_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = signExtend2sCompl(instr.getImm32());
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMUL_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMUL_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMULH_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMULH_R;
			ibc.idst = &nreg->r[dst];
			ibc.isrc = &nreg->r[src];
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMULH_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IMULH_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISMULH_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISMULH_R;
			ibc.idst = &nreg->r[dst];
			ibc.isrc = &nreg->r[src];
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISMULH_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISMULH_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IMUL_RCP) {
			uint64_t divisor = instr.getImm32();
			if (!isZeroOrPowerOf2(divisor)) {
				auto dst = instr.dst % RegistersCount;
				ibc.type = InstructionType::IMUL_R;
				ibc.idst = &nreg->r[dst];
				ibc.imm = randomx_reciprocal(divisor);
				ibc.isrc = &ibc.imm;
				registerUsage[dst] = i;
			}
			else {
				ibc.type = InstructionType::NOP;
			}
			return;
		}

		if (opcode < ceil_INEG_R) {
			auto dst = instr.dst % RegistersCount;
			ibc.type = InstructionType::INEG_R;
			ibc.idst = &nreg->r[dst];
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IXOR_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IXOR_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = signExtend2sCompl(instr.getImm32());
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IXOR_M) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IXOR_M;
			ibc.idst = &nreg->r[dst];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			}
			else {
				ibc.isrc = &zero;
				ibc.memMask = ScratchpadL3Mask;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IROR_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IROR_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = instr.getImm32();
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_IROL_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::IROL_R;
			ibc.idst = &nreg->r[dst];
			if (src != dst) {
				ibc.isrc = &nreg->r[src];
			}
			else {
				ibc.imm = instr.getImm32();
				ibc.isrc = &ibc.imm;
			}
			registerUsage[dst] = i;
			return;
		}

		if (opcode < ceil_ISWAP_R) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			if (src != dst) {
				ibc.idst = &nreg->r[dst];
				ibc.isrc = &nreg->r[src];
				ibc.type = InstructionType::ISWAP_R;
				registerUsage[dst] = i;
				registerUsage[src] = i;
			}
			else {
				ibc.type = InstructionType::NOP;
			}
			return;
		}

		if (opcode < ceil_FSWAP_R) {
			auto dst = instr.dst % RegistersCount;
			ibc.type = InstructionType::FSWAP_R;
			if (dst < RegisterCountFlt)
				ibc.fdst = &nreg->f[dst];
			else
				ibc.fdst = &nreg->e[dst - RegisterCountFlt];
			return;
		}

		if (opcode < ceil_FADD_R) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegisterCountFlt;
			ibc.type = InstructionType::FADD_R;
			ibc.fdst = &nreg->f[dst];
			ibc.fsrc = &nreg->a[src];
			return;
		}

		if (opcode < ceil_FADD_M) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::FADD_M;
			ibc.fdst = &nreg->f[dst];
			ibc.isrc = &nreg->r[src];
			ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			ibc.imm = signExtend2sCompl(instr.getImm32());
			return;
		}

		if (opcode < ceil_FSUB_R) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegisterCountFlt;
			ibc.type = InstructionType::FSUB_R;
			ibc.fdst = &nreg->f[dst];
			ibc.fsrc = &nreg->a[src];
			return;
		}

		if (opcode < ceil_FSUB_M) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::FSUB_M;
			ibc.fdst = &nreg->f[dst];
			ibc.isrc = &nreg->r[src];
			ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			ibc.imm = signExtend2sCompl(instr.getImm32());
			return;
		}

		if (opcode < ceil_FSCAL_R) {
			auto dst = instr.dst % RegisterCountFlt;
			ibc.fdst = &nreg->f[dst];
			ibc.type = InstructionType::FSCAL_R;
			return;
		}

		if (opcode < ceil_FMUL_R) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegisterCountFlt;
			ibc.type = InstructionType::FMUL_R;
			ibc.fdst = &nreg->e[dst];
			ibc.fsrc = &nreg->a[src];
			return;
		}

		if (opcode < ceil_FDIV_M) {
			auto dst = instr.dst % RegisterCountFlt;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::FDIV_M;
			ibc.fdst = &nreg->e[dst];
			ibc.isrc = &nreg->r[src];
			ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			ibc.imm = signExtend2sCompl(instr.getImm32());
			return;
		}

		if (opcode < ceil_FSQRT_R) {
			auto dst = instr.dst % RegisterCountFlt;
			ibc.type = InstructionType::FSQRT_R;
			ibc.fdst = &nreg->e[dst];
			return;
		}

		if (opcode < ceil_CBRANCH) {
			ibc.type = InstructionType::CBRANCH;
			//jump condition
			int creg = instr.dst % RegistersCount;
			ibc.idst = &nreg->r[creg];
			ibc.target = registerUsage[creg];
			int shift = instr.getModCond() + ConditionOffset;
			ibc.imm = signExtend2sCompl(instr.getImm32()) | (1ULL << shift);
			if (ConditionOffset > 0 || shift > 0) //clear the bit below the condition mask - this limits the number of successive jumps to 2
				ibc.imm &= ~(1ULL << (shift - 1));
			ibc.memMask = ConditionMask << shift;
			//mark all registers as used
			for (unsigned j = 0; j < RegistersCount; ++j) {
				registerUsage[j] = i;
			}
			return;
		}

		if (opcode < ceil_CFROUND) {
			auto src = instr.src % RegistersCount;
			ibc.isrc = &nreg->r[src];
			ibc.type = InstructionType::CFROUND;
			ibc.imm = instr.getImm32() & 63;
			return;
		}

		if (opcode < ceil_ISTORE) {
			auto dst = instr.dst % RegistersCount;
			auto src = instr.src % RegistersCount;
			ibc.type = InstructionType::ISTORE;
			ibc.idst = &nreg->r[dst];
			ibc.isrc = &nreg->r[src];
			ibc.imm = signExtend2sCompl(instr.getImm32());
			if (instr.getModCond() < StoreL3Condition)
				ibc.memMask = (instr.getModMem() ? ScratchpadL1Mask : ScratchpadL2Mask);
			else
				ibc.memMask = ScratchpadL3Mask;
			return;
		}

		if (opcode < ceil_NOP) {
			ibc.type = InstructionType::NOP;
			return;
		}

		UNREACHABLE;
	}